

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O1

Clause * __thiscall seq_precede_inc::explain(seq_precede_inc *this,Lit param_1,int inf_id)

{
  int iVar1;
  Clause *pCVar2;
  tag_t t;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  IntVar *pIVar7;
  size_t __size;
  Clause *pCStack_50;
  vec<Lit> vStack_48;
  
  uVar6 = (uint)inf_id >> 1 & 0x7fff;
  uVar3 = (uint)inf_id >> 0x10;
  if ((inf_id & 1U) != 0) {
    pCVar2 = ex_ub(this,uVar6,uVar3);
    return pCVar2;
  }
  vStack_48.sz = 0;
  vStack_48.cap = 0;
  vStack_48.data = (Lit *)0x0;
  vec<Lit>::push(&vStack_48);
  if (uVar6 != 0) {
    uVar5 = 0;
    do {
      pIVar7 = (this->xs).data[uVar5];
      iVar1 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xd])(pIVar7,(long)(int)uVar3,2)
      ;
      pCStack_50 = (Clause *)CONCAT44(pCStack_50._4_4_,iVar1);
      vec<Lit>::push(&vStack_48,(Lit *)&pCStack_50);
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  pIVar7 = (this->xs).data[uVar6 + 1];
  if ((pIVar7->min).v <= (int)uVar3) {
    uVar6 = uVar6 + 2;
    do {
      if (((pIVar7->max).v < (int)uVar3) ||
         ((pIVar7->vals != (Tchar *)0x0 && (pIVar7->vals[(int)uVar3].v == '\0')))) {
        iVar1 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xd])
                          (pIVar7,(long)(int)uVar3,1);
        pCStack_50 = (Clause *)CONCAT44(pCStack_50._4_4_,iVar1);
        vec<Lit>::push(&vStack_48,(Lit *)&pCStack_50);
      }
      else {
        uVar3 = uVar3 + 1;
      }
      pIVar7 = (this->xs).data[uVar6];
      uVar6 = uVar6 + 1;
    } while ((pIVar7->min).v <= (int)uVar3);
  }
  iVar1 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xd])(pIVar7,(long)(int)uVar3,3);
  pCStack_50 = (Clause *)CONCAT44(pCStack_50._4_4_,iVar1);
  vec<Lit>::push(&vStack_48,(Lit *)&pCStack_50);
  uVar3 = vStack_48.sz;
  uVar5 = vStack_48._0_8_ & 0xffffffff;
  __size = 8;
  if (vStack_48.sz != 0) {
    __size = (ulong)(vStack_48.sz - 1) * 4 + 8;
  }
  pCStack_50 = (Clause *)malloc(__size);
  uVar6 = *(uint *)pCStack_50;
  pCStack_50->data[0].x = -2;
  *(uint *)pCStack_50 = uVar6 & 0xfc | uVar3 << 8;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      pCStack_50->data[uVar4].x = vStack_48.data[uVar4].x;
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  *(byte *)pCStack_50 = *(byte *)pCStack_50 | 2;
  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&pCStack_50);
  pCVar2 = pCStack_50;
  if (vStack_48.data != (Lit *)0x0) {
    free(vStack_48.data);
  }
  return pCVar2;
}

Assistant:

Clause* explain(Lit /*p*/, int inf_id) override {
		const tag_t t(conv<tag_t, int>(inf_id));
		if (t.flag) {
			// Upper bound
			return ex_ub(t.x, t.k);
		}  // Lower bound
		return ex_lb(t.x, t.k);
	}